

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::
IMUElasticLocalFrameDynamicalSystem(IMUElasticLocalFrameDynamicalSystem *this,double dt)

{
  Vector *__s;
  double *pdVar1;
  undefined8 *puVar2;
  
  DynamicalSystemFunctorBase::DynamicalSystemFunctorBase(&this->super_DynamicalSystemFunctorBase);
  (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
       (_func_int **)&PTR__IMUElasticLocalFrameDynamicalSystem_0018e9b0;
  AccelerometerGyrometer::AccelerometerGyrometer(&this->sensor_);
  this->processNoise_ = (NoiseBase *)0x0;
  this->dt_ = dt;
  this->robotMass_ = 56.8;
  this->robotMassInv_ = 0.017605633802816902;
  __s = &this->fc_;
  memset(__s,0,0x90);
  this->measurementSize_ = 6;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contactPositions_).
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->withForceMeasurements_ = false;
  this->withComBias_ = false;
  this->withAbsolutePos_ = false;
  this->withUnmodeledForces_ = false;
  this->marginalStabilityFactor_ = 0.9999;
  Optimization::Optimization(&this->op_);
  (this->Kfe_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [0] = 40000.0;
  (this->Kfe_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->Kfe_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->Kfe_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [3] = 0.0;
  (this->Kfe_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [4] = 40000.0;
  (this->Kfe_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  (this->Kfe_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  (this->Kfe_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [7] = 0.0;
  (this->Kfe_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [8] = 40000.0;
  (this->Kte_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [0] = 600.0;
  (this->Kte_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->Kte_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->Kte_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [3] = 0.0;
  (this->Kte_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [4] = 600.0;
  (this->Kte_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  (this->Kte_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  (this->Kte_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [7] = 0.0;
  (this->Kte_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [8] = 600.0;
  (this->Kfv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [0] = 600.0;
  (this->Kfv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->Kfv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->Kfv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [3] = 0.0;
  (this->Kfv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [4] = 600.0;
  (this->Kfv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [7] = 0.0;
  (this->Kfv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  (this->Kfv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  (this->Kfv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [8] = 600.0;
  (this->Ktv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [0] = 60.0;
  (this->Ktv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->Ktv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->Ktv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [3] = 0.0;
  (this->Ktv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [4] = 60.0;
  (this->Ktv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  (this->Ktv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  (this->Ktv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [7] = 0.0;
  (this->Ktv_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [8] = 60.0;
  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = 40000.0;
  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = 0.0;
  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = 0.0;
  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = 0.0;
  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = 40000.0;
  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = 0.0;
  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[6] = 0.0;
  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[7] = 0.0;
  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = 40000.0;
  (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = 600.0;
  (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = 0.0;
  (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = 0.0;
  (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = 0.0;
  (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = 600.0;
  (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[7] = 0.0;
  (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = 0.0;
  (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[6] = 0.0;
  (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = 600.0;
  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = 600.0;
  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = 0.0;
  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = 0.0;
  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = 0.0;
  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = 600.0;
  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[7] = 0.0;
  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = 0.0;
  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[6] = 0.0;
  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = 600.0;
  (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = 60.0;
  (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = 0.0;
  (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = 0.0;
  (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = 0.0;
  (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = 60.0;
  (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[7] = 0.0;
  (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = 0.0;
  (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[6] = 0.0;
  (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[8] = 60.0;
  AccelerometerGyrometer::setMatrixMode(&this->sensor_,true);
  this->contactModel_ = 0;
  this->inputSize_ = 0x30;
  this->nbContacts_ = 0;
  this->kcurrent_ = 0xffffffff;
  if ((this->fc_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      6) {
    free((__s->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data);
    pdVar1 = (double *)malloc(0x30);
    if (((ulong)pdVar1 & 0xf) != 0) goto LAB_00150376;
    if (pdVar1 == (double *)0x0) goto LAB_00150395;
    (__s->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar1;
  }
  (this->fc_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 6;
  pdVar1 = (this->fc_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  pdVar1[4] = 0.0;
  pdVar1[5] = 0.0;
  pdVar1[2] = 0.0;
  pdVar1[3] = 0.0;
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  if ((this->tc_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      6) {
    free((this->tc_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        );
    pdVar1 = (double *)malloc(0x30);
    if (((ulong)pdVar1 & 0xf) != 0) {
LAB_00150376:
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar1 == (double *)0x0) {
LAB_00150395:
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = std::ios::widen;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (this->tc_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar1;
  }
  (this->tc_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 6;
  pdVar1 = (this->tc_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  pdVar1[4] = 0.0;
  pdVar1[5] = 0.0;
  pdVar1[2] = 0.0;
  pdVar1[3] = 0.0;
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  this->printed_ = false;
  (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  return;
}

Assistant:

IMUElasticLocalFrameDynamicalSystem::
    	IMUElasticLocalFrameDynamicalSystem(double dt):
        processNoise_(0x0), dt_(dt),
        robotMass_(hrp2::m),
        robotMassInv_(1/hrp2::m),
        measurementSize_(measurementSizeBase_),
        withForceMeasurements_(false), withComBias_(false), withAbsolutePos_(false),
        withUnmodeledForces_(false),
        marginalStabilityFactor_(0.9999)
    {
#ifdef STATEOBSERVATION_VERBOUS_CONSTRUCTORS
       // std::cout<<std::endl<<"IMUElasticLocalFrameDynamicalSystem Constructor"<<std::endl;

#endif //STATEOBSERVATION_VERBOUS_CONSTRUCTOR
      Kfe_=40000*Matrix3::Identity();
      Kte_=600*Matrix3::Identity();
      Kfv_=600*Matrix3::Identity();
      Ktv_=60*Matrix3::Identity();

      KfeRopes_=40000*Matrix3::Identity();
      KteRopes_=600*Matrix3::Identity();
      KfvRopes_=600*Matrix3::Identity();
      KtvRopes_=60*Matrix3::Identity();

      sensor_.setMatrixMode(true);

      contactModel_=contactModel::none;

      nbContacts_=0;
      inputSize_=input::inputSizeBase;

      kcurrent_=-1;

      fc_.resize(hrp2::contact::nbModeledMax*3); fc_.setZero();
      tc_.resize(hrp2::contact::nbModeledMax*3); tc_.setZero();

      printed_ = false;
      pe.setZero();

    }